

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

void __thiscall QListViewPrivate::scrollElasticBandBy(QListViewPrivate *this,int dx,int dy)

{
  Representation *pRVar1;
  
  if (dx < 1) {
    if (dx < 0) {
      pRVar1 = &(this->elasticBand).x2;
      pRVar1->m_i = pRVar1->m_i - dx;
      (this->elasticBand).x1.m_i = (this->elasticBand).x1.m_i - dx;
    }
  }
  else {
    (this->elasticBand).x1.m_i = (this->elasticBand).x1.m_i + dx;
    pRVar1 = &(this->elasticBand).x2;
    pRVar1->m_i = pRVar1->m_i + dx;
  }
  if (0 < dy) {
    pRVar1 = &(this->elasticBand).y1;
    pRVar1->m_i = pRVar1->m_i + dy;
    pRVar1 = &(this->elasticBand).y2;
    pRVar1->m_i = pRVar1->m_i + dy;
    return;
  }
  if (-1 < dy) {
    return;
  }
  pRVar1 = &(this->elasticBand).y2;
  pRVar1->m_i = pRVar1->m_i - dy;
  pRVar1 = &(this->elasticBand).y1;
  pRVar1->m_i = pRVar1->m_i - dy;
  return;
}

Assistant:

void QListViewPrivate::scrollElasticBandBy(int dx, int dy)
{
    if (dx > 0) // right
        elasticBand.moveRight(elasticBand.right() + dx);
    else if (dx < 0) // left
        elasticBand.moveLeft(elasticBand.left() - dx);
    if (dy > 0) // down
        elasticBand.moveBottom(elasticBand.bottom() + dy);
    else if (dy < 0) // up
        elasticBand.moveTop(elasticBand.top() - dy);
}